

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicState1::Run(BasicState1 *this)

{
  long local_30;
  GLint64 p64;
  GLint64 p64_1;
  GLuint i;
  GLint p;
  BasicState1 *this_local;
  
  _i = this;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,1000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,1000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x82da,(GLint *)((long)&p64_1 + 4));
  if ((int)p64_1._4_4_ < 0x10) {
    anon_unknown_0::Output
              ("GL_MAX_VERTEX_ATTRIB_BINDINGS is %d but must be at least 16.\n",(ulong)p64_1._4_4_);
    this_local = (BasicState1 *)&DAT_ffffffffffffffff;
  }
  else {
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x82d9,(GLint *)((long)&p64_1 + 4));
    if ((int)p64_1._4_4_ < 0x7ff) {
      anon_unknown_0::Output
                ("GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET is %d but must be at least 2047.\n",
                 (ulong)p64_1._4_4_);
      this_local = (BasicState1 *)&DAT_ffffffffffffffff;
    }
    else {
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vao);
      for (p64_1._0_4_ = 0; (uint)p64_1 < 0x10; p64_1._0_4_ = (uint)p64_1 + 1) {
        glu::CallLogWrapper::glGetVertexAttribiv
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,(uint)p64_1,0x82d4,(GLint *)((long)&p64_1 + 4));
        if ((uint)p64_1 != p64_1._4_4_) {
          anon_unknown_0::Output
                    ("GL_VERTEX_ATTRIB_BINDING(%d) is %d should be %d.\n",(ulong)(uint)p64_1,
                     (ulong)p64_1._4_4_,(ulong)(uint)p64_1);
          return (long)&DAT_ffffffffffffffff;
        }
        glu::CallLogWrapper::glGetVertexAttribiv
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,(uint)p64_1,0x82d5,(GLint *)((long)&p64_1 + 4));
        if (p64_1._4_4_ != 0) {
          anon_unknown_0::Output
                    ("GL_VERTEX_ATTRIB_RELATIVE_OFFSET(%d) is %d should be %d.\n",(ulong)(uint)p64_1
                     ,(ulong)p64_1._4_4_,0);
          return (long)&DAT_ffffffffffffffff;
        }
        glu::CallLogWrapper::glGetInteger64i_v
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x82d7,(uint)p64_1,&p64);
        if (p64 != 0) {
          anon_unknown_0::Output("GL_VERTEX_BINDING_OFFSET(%d) should be 0.\n",(ulong)(uint)p64_1);
          return (long)&DAT_ffffffffffffffff;
        }
        glu::CallLogWrapper::glGetIntegeri_v
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x82d8,(uint)p64_1,(GLint *)((long)&p64_1 + 4));
        if (p64_1._4_4_ != 0x10) {
          anon_unknown_0::Output
                    ("GL_VERTEX_BINDING_STRIDE(%d) is %d should be 16.\n",(ulong)(uint)p64_1,
                     (ulong)p64_1._4_4_);
          return (long)&DAT_ffffffffffffffff;
        }
      }
      glu::CallLogWrapper::glVertexAttribFormat
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,2,0x1400,'\x01',0x10);
      glu::CallLogWrapper::glGetVertexAttribiv
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0x8623,(GLint *)((long)&p64_1 + 4));
      if (p64_1._4_4_ == 2) {
        glu::CallLogWrapper::glGetVertexAttribiv
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,0x8625,(GLint *)((long)&p64_1 + 4));
        if (p64_1._4_4_ == 0x1400) {
          glu::CallLogWrapper::glGetVertexAttribiv
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0,0x886a,(GLint *)((long)&p64_1 + 4));
          if (p64_1._4_4_ == 1) {
            glu::CallLogWrapper::glGetVertexAttribiv
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0,0x82d5,(GLint *)((long)&p64_1 + 4));
            if (p64_1._4_4_ == 0x10) {
              glu::CallLogWrapper::glVertexAttribIFormat
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,2,3,0x1404,0x200);
              glu::CallLogWrapper::glGetVertexAttribiv
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,2,0x8623,(GLint *)((long)&p64_1 + 4));
              if (p64_1._4_4_ == 3) {
                glu::CallLogWrapper::glGetVertexAttribiv
                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,2,0x8625,(GLint *)((long)&p64_1 + 4));
                if (p64_1._4_4_ == 0x1404) {
                  glu::CallLogWrapper::glGetVertexAttribiv
                            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper,2,0x82d5,
                             (GLint *)((long)&p64_1 + 4));
                  if (p64_1._4_4_ == 0x200) {
                    glu::CallLogWrapper::glGetVertexAttribiv
                              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                super_GLWrapper.super_CallLogWrapper,2,0x88fd,
                               (GLint *)((long)&p64_1 + 4));
                    if (p64_1._4_4_ == 1) {
                      glu::CallLogWrapper::glVertexAttribLFormat
                                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,0xf,1,0x140a,0x400);
                      glu::CallLogWrapper::glGetVertexAttribiv
                                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,0xf,0x8623,
                                 (GLint *)((long)&p64_1 + 4));
                      if (p64_1._4_4_ == 1) {
                        glu::CallLogWrapper::glGetVertexAttribiv
                                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                    super_GLWrapper.super_CallLogWrapper,0xf,0x8625,
                                   (GLint *)((long)&p64_1 + 4));
                        if (p64_1._4_4_ == 0x140a) {
                          glu::CallLogWrapper::glGetVertexAttribiv
                                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                      super_GLWrapper.super_CallLogWrapper,0xf,0x82d5,
                                     (GLint *)((long)&p64_1 + 4));
                          if (p64_1._4_4_ == 0x400) {
                            glu::CallLogWrapper::glGetVertexAttribiv
                                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                        super_GLWrapper.super_CallLogWrapper,0xf,0x874e,
                                       (GLint *)((long)&p64_1 + 4));
                            if (p64_1._4_4_ == 1) {
                              glu::CallLogWrapper::glVertexAttribBinding
                                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                          super_GLWrapper.super_CallLogWrapper,0,7);
                              glu::CallLogWrapper::glGetVertexAttribiv
                                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                          super_GLWrapper.super_CallLogWrapper,0,0x82d4,
                                         (GLint *)((long)&p64_1 + 4));
                              if (p64_1._4_4_ == 7) {
                                glu::CallLogWrapper::glVertexAttribBinding
                                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                            super_GLWrapper.super_CallLogWrapper,3,7);
                                glu::CallLogWrapper::glGetVertexAttribiv
                                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                            super_GLWrapper.super_CallLogWrapper,3,0x82d4,
                                           (GLint *)((long)&p64_1 + 4));
                                if (p64_1._4_4_ == 7) {
                                  glu::CallLogWrapper::glVertexAttribBinding
                                            (&(this->super_VertexAttribBindingBase).
                                              super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
                                             ,9,0);
                                  glu::CallLogWrapper::glGetVertexAttribiv
                                            (&(this->super_VertexAttribBindingBase).
                                              super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
                                             ,9,0x82d4,(GLint *)((long)&p64_1 + 4));
                                  if (p64_1._4_4_ == 0) {
                                    glu::CallLogWrapper::glVertexAttribBinding
                                              (&(this->super_VertexAttribBindingBase).
                                                super_SubcaseBase.super_GLWrapper.
                                                super_CallLogWrapper,0xf,1);
                                    glu::CallLogWrapper::glGetVertexAttribiv
                                              (&(this->super_VertexAttribBindingBase).
                                                super_SubcaseBase.super_GLWrapper.
                                                super_CallLogWrapper,0xf,0x82d4,
                                               (GLint *)((long)&p64_1 + 4));
                                    if (p64_1._4_4_ == 1) {
                                      glu::CallLogWrapper::glVertexAttribBinding
                                                (&(this->super_VertexAttribBindingBase).
                                                  super_SubcaseBase.super_GLWrapper.
                                                  super_CallLogWrapper,0xf,0xf);
                                      glu::CallLogWrapper::glGetVertexAttribiv
                                                (&(this->super_VertexAttribBindingBase).
                                                  super_SubcaseBase.super_GLWrapper.
                                                  super_CallLogWrapper,0xf,0x82d4,
                                                 (GLint *)((long)&p64_1 + 4));
                                      if (p64_1._4_4_ == 0xf) {
                                        glu::CallLogWrapper::glBindVertexBuffer
                                                  (&(this->super_VertexAttribBindingBase).
                                                    super_SubcaseBase.super_GLWrapper.
                                                    super_CallLogWrapper,0,this->m_vbo[0],0x400,0x80
                                                  );
                                        glu::CallLogWrapper::glGetInteger64i_v
                                                  (&(this->super_VertexAttribBindingBase).
                                                    super_SubcaseBase.super_GLWrapper.
                                                    super_CallLogWrapper,0x82d7,0,&local_30);
                                        if (local_30 == 0x400) {
                                          glu::CallLogWrapper::glGetIntegeri_v
                                                    (&(this->super_VertexAttribBindingBase).
                                                      super_SubcaseBase.super_GLWrapper.
                                                      super_CallLogWrapper,0x82d8,0,
                                                     (GLint *)((long)&p64_1 + 4));
                                          if (p64_1._4_4_ == 0x80) {
                                            glu::CallLogWrapper::glGetVertexAttribiv
                                                      (&(this->super_VertexAttribBindingBase).
                                                        super_SubcaseBase.super_GLWrapper.
                                                        super_CallLogWrapper,0,0x8624,
                                                       (GLint *)((long)&p64_1 + 4));
                                            if (p64_1._4_4_ == 0) {
                                              glu::CallLogWrapper::glGetVertexAttribiv
                                                        (&(this->super_VertexAttribBindingBase).
                                                          super_SubcaseBase.super_GLWrapper.
                                                          super_CallLogWrapper,0,0x889f,
                                                         (GLint *)((long)&p64_1 + 4));
                                              if (p64_1._4_4_ == 0) {
                                                glu::CallLogWrapper::glBindVertexBuffer
                                                          (&(this->super_VertexAttribBindingBase).
                                                            super_SubcaseBase.super_GLWrapper.
                                                            super_CallLogWrapper,0xf,this->m_vbo[1],
                                                           0x10,0x20);
                                                glu::CallLogWrapper::glGetInteger64i_v
                                                          (&(this->super_VertexAttribBindingBase).
                                                            super_SubcaseBase.super_GLWrapper.
                                                            super_CallLogWrapper,0x82d7,0xf,
                                                           &local_30);
                                                if (local_30 == 0x10) {
                                                  glu::CallLogWrapper::glGetIntegeri_v
                                                            (&(this->super_VertexAttribBindingBase).
                                                              super_SubcaseBase.super_GLWrapper.
                                                              super_CallLogWrapper,0x82d8,0xf,
                                                             (GLint *)((long)&p64_1 + 4));
                                                  if (p64_1._4_4_ == 0x20) {
                                                    glu::CallLogWrapper::glGetVertexAttribiv
                                                              (&(this->super_VertexAttribBindingBase
                                                                ).super_SubcaseBase.super_GLWrapper.
                                                                super_CallLogWrapper,0xf,0x8624,
                                                               (GLint *)((long)&p64_1 + 4));
                                                    if (p64_1._4_4_ == 0) {
                                                      glu::CallLogWrapper::glGetVertexAttribiv
                                                                (&(this->
                                                  super_VertexAttribBindingBase).super_SubcaseBase.
                                                  super_GLWrapper.super_CallLogWrapper,0xf,0x889f,
                                                  (GLint *)((long)&p64_1 + 4));
                                                  if (p64_1._4_4_ == this->m_vbo[1]) {
                                                    this_local = (BasicState1 *)0x0;
                                                  }
                                                  else {
                                                    anon_unknown_0::Output
                                                              (
                                                  "GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING(15) is %d should be %d.\n"
                                                  ,(ulong)p64_1._4_4_,(ulong)this->m_vbo[1]);
                                                  this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    anon_unknown_0::Output
                                                              (
                                                  "GL_VERTEX_ATTRIB_ARRAY_STRIDE(15) is %d should be 0.\n"
                                                  ,(ulong)p64_1._4_4_);
                                                  this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    anon_unknown_0::Output
                                                              (
                                                  "GL_VERTEX_BINDING_STRIDE(15) is %d should be 32.\n"
                                                  ,(ulong)p64_1._4_4_);
                                                  this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                                                  }
                                                }
                                                else {
                                                  anon_unknown_0::Output
                                                            (
                                                  "GL_VERTEX_BINDING_OFFSET(15) should be 16.\n");
                                                  this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                                                }
                                              }
                                              else {
                                                anon_unknown_0::Output
                                                          (
                                                  "GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING(0) is %d should be %d.\n"
                                                  ,(ulong)p64_1._4_4_,0);
                                                this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                                              }
                                            }
                                            else {
                                              anon_unknown_0::Output
                                                        (
                                                  "GL_VERTEX_ATTRIB_ARRAY_STRIDE(0) is %d should be 0.\n"
                                                  ,(ulong)p64_1._4_4_);
                                              this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                                            }
                                          }
                                          else {
                                            anon_unknown_0::Output
                                                      (
                                                  "GL_VERTEX_BINDING_STRIDE(0) is %d should be 128.\n"
                                                  ,(ulong)p64_1._4_4_);
                                            this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                                          }
                                        }
                                        else {
                                          anon_unknown_0::Output
                                                    ("GL_VERTEX_BINDING_OFFSET(0) should be 1024.\n"
                                                    );
                                          this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                                        }
                                      }
                                      else {
                                        this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                                      }
                                    }
                                    else {
                                      this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                                    }
                                  }
                                  else {
                                    this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                                  }
                                }
                                else {
                                  this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                                }
                              }
                              else {
                                this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                              }
                            }
                            else {
                              anon_unknown_0::Output
                                        ("GL_VERTEX_ATTRIB_ARRAY_LONG(15) is %d should be GL_TRUE.\n"
                                         ,(ulong)p64_1._4_4_);
                              this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                            }
                          }
                          else {
                            anon_unknown_0::Output
                                      ("GL_VERTEX_ATTRIB_RELATIVE_OFFSET(15) is %d should be 1024.\n"
                                       ,(ulong)p64_1._4_4_);
                            this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                          }
                        }
                        else {
                          anon_unknown_0::Output
                                    ("GL_VERTEX_ATTRIB_ARRAY_TYPE(15) is %d should be GL_DOUBLE.\n",
                                     (ulong)p64_1._4_4_);
                          this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                        }
                      }
                      else {
                        anon_unknown_0::Output
                                  ("GL_VERTEX_ATTRIB_ARRAY_SIZE(15) is %d should be 1.\n",
                                   (ulong)p64_1._4_4_);
                        this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      anon_unknown_0::Output
                                ("GL_VERTEX_ATTRIB_ARRAY_INTEGER(2) is %d should be GL_TRUE.\n",
                                 (ulong)p64_1._4_4_);
                      this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    anon_unknown_0::Output
                              ("GL_VERTEX_ATTRIB_RELATIVE_OFFSET(2) is %d should be 512.\n",
                               (ulong)p64_1._4_4_);
                    this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  anon_unknown_0::Output
                            ("GL_VERTEX_ATTRIB_ARRAY_TYPE(2) is %d should be GL_INT.\n",
                             (ulong)p64_1._4_4_);
                  this_local = (BasicState1 *)&DAT_ffffffffffffffff;
                }
              }
              else {
                anon_unknown_0::Output
                          ("GL_VERTEX_ATTRIB_ARRAY_SIZE(2) is %d should be 3.\n",(ulong)p64_1._4_4_)
                ;
                this_local = (BasicState1 *)&DAT_ffffffffffffffff;
              }
            }
            else {
              anon_unknown_0::Output
                        ("GL_VERTEX_ATTRIB_RELATIVE_OFFSET(0) is %d should be 16.\n",
                         (ulong)p64_1._4_4_);
              this_local = (BasicState1 *)&DAT_ffffffffffffffff;
            }
          }
          else {
            anon_unknown_0::Output
                      ("GL_VERTEX_ATTRIB_ARRAY_NORMALIZED(0) is %d should be GL_TRUE.\n",
                       (ulong)p64_1._4_4_);
            this_local = (BasicState1 *)&DAT_ffffffffffffffff;
          }
        }
        else {
          anon_unknown_0::Output
                    ("GL_VERTEX_ATTRIB_ARRAY_TYPE(0) is %d should be GL_BYTE.\n",(ulong)p64_1._4_4_)
          ;
          this_local = (BasicState1 *)&DAT_ffffffffffffffff;
        }
      }
      else {
        anon_unknown_0::Output
                  ("GL_VERTEX_ATTRIB_ARRAY_SIZE(0) is %d should be 2.\n",(ulong)p64_1._4_4_);
        this_local = (BasicState1 *)&DAT_ffffffffffffffff;
      }
    }
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, 1000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, 1000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &p);
		if (p < 16)
		{
			Output("GL_MAX_VERTEX_ATTRIB_BINDINGS is %d but must be at least 16.\n", p);
			return ERROR;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		if (p < 2047)
		{
			Output("GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET is %d but must be at least 2047.\n", p);
			return ERROR;
		}

		glBindVertexArray(m_vao);
		// check default state
		for (GLuint i = 0; i < 16; ++i)
		{
			glGetVertexAttribiv(i, GL_VERTEX_ATTRIB_BINDING, &p);
			if (static_cast<GLint>(i) != p)
			{
				Output("GL_VERTEX_ATTRIB_BINDING(%d) is %d should be %d.\n", i, p, i);
				return ERROR;
			}
			glGetVertexAttribiv(i, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
			if (p != 0)
			{
				Output("GL_VERTEX_ATTRIB_RELATIVE_OFFSET(%d) is %d should be %d.\n", i, p, 0);
				return ERROR;
			}
			GLint64 p64;
			glGetInteger64i_v(GL_VERTEX_BINDING_OFFSET, i, &p64);
			if (p64 != 0)
			{
				Output("GL_VERTEX_BINDING_OFFSET(%d) should be 0.\n", i);
				return ERROR;
			}
			glGetIntegeri_v(GL_VERTEX_BINDING_STRIDE, i, &p);
			if (p != 16)
			{
				Output("GL_VERTEX_BINDING_STRIDE(%d) is %d should be 16.\n", i, p);
				return ERROR;
			}
		}
		glVertexAttribFormat(0, 2, GL_BYTE, GL_TRUE, 16);
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_ARRAY_SIZE, &p);
		if (p != 2)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_SIZE(0) is %d should be 2.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_ARRAY_TYPE, &p);
		if (p != GL_BYTE)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_TYPE(0) is %d should be GL_BYTE.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, &p);
		if (p != GL_TRUE)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_NORMALIZED(0) is %d should be GL_TRUE.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		if (p != 16)
		{
			Output("GL_VERTEX_ATTRIB_RELATIVE_OFFSET(0) is %d should be 16.\n", p);
			return ERROR;
		}

		glVertexAttribIFormat(2, 3, GL_INT, 512);
		glGetVertexAttribiv(2, GL_VERTEX_ATTRIB_ARRAY_SIZE, &p);
		if (p != 3)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_SIZE(2) is %d should be 3.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(2, GL_VERTEX_ATTRIB_ARRAY_TYPE, &p);
		if (p != GL_INT)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_TYPE(2) is %d should be GL_INT.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(2, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		if (p != 512)
		{
			Output("GL_VERTEX_ATTRIB_RELATIVE_OFFSET(2) is %d should be 512.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(2, GL_VERTEX_ATTRIB_ARRAY_INTEGER, &p);
		if (p != GL_TRUE)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_INTEGER(2) is %d should be GL_TRUE.\n", p);
			return ERROR;
		}

		glVertexAttribLFormat(15, 1, GL_DOUBLE, 1024);
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_ARRAY_SIZE, &p);
		if (p != 1)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_SIZE(15) is %d should be 1.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_ARRAY_TYPE, &p);
		if (p != GL_DOUBLE)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_TYPE(15) is %d should be GL_DOUBLE.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		if (p != 1024)
		{
			Output("GL_VERTEX_ATTRIB_RELATIVE_OFFSET(15) is %d should be 1024.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_ARRAY_LONG, &p);
		if (p != GL_TRUE)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_LONG(15) is %d should be GL_TRUE.\n", p);
			return ERROR;
		}

		glVertexAttribBinding(0, 7);
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_BINDING, &p);
		if (p != 7)
			return ERROR;
		glVertexAttribBinding(3, 7);
		glGetVertexAttribiv(3, GL_VERTEX_ATTRIB_BINDING, &p);
		if (p != 7)
			return ERROR;
		glVertexAttribBinding(9, 0);
		glGetVertexAttribiv(9, GL_VERTEX_ATTRIB_BINDING, &p);
		if (p != 0)
			return ERROR;
		glVertexAttribBinding(15, 1);
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_BINDING, &p);
		if (p != 1)
			return ERROR;
		glVertexAttribBinding(15, 15);
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_BINDING, &p);
		if (p != 15)
			return ERROR;

		glBindVertexBuffer(0, m_vbo[0], 1024, 128);
		GLint64 p64;
		glGetInteger64i_v(GL_VERTEX_BINDING_OFFSET, 0, &p64);
		if (p64 != 1024)
		{
			Output("GL_VERTEX_BINDING_OFFSET(0) should be 1024.\n");
			return ERROR;
		}
		glGetIntegeri_v(GL_VERTEX_BINDING_STRIDE, 0, &p);
		if (p != 128)
		{
			Output("GL_VERTEX_BINDING_STRIDE(0) is %d should be 128.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, &p);
		if (p != 0)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_STRIDE(0) is %d should be 0.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING, &p);
		if (p != 0)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING(0) is %d should be %d.\n", p, 0);
			return ERROR;
		}

		glBindVertexBuffer(15, m_vbo[1], 16, 32);
		glGetInteger64i_v(GL_VERTEX_BINDING_OFFSET, 15, &p64);
		if (p64 != 16)
		{
			Output("GL_VERTEX_BINDING_OFFSET(15) should be 16.\n");
			return ERROR;
		}
		glGetIntegeri_v(GL_VERTEX_BINDING_STRIDE, 15, &p);
		if (p != 32)
		{
			Output("GL_VERTEX_BINDING_STRIDE(15) is %d should be 32.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_ARRAY_STRIDE, &p);
		if (p != 0)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_STRIDE(15) is %d should be 0.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING, &p);
		if (p != static_cast<GLint>(m_vbo[1]))
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING(15) is %d should be %d.\n", p, m_vbo[1]);
			return ERROR;
		}

		return NO_ERROR;
	}